

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O2

GlobRank __thiscall
slang::svGlobInternal
          (slang *this,path *basePath,string_view pattern,GlobMode mode,
          SmallVector<std::filesystem::__cxx11::path,_2UL> *results,bool *anyWildcards)

{
  char cVar1;
  bool bVar2;
  GlobRank GVar3;
  path *ppVar4;
  path *dir;
  pointer ppVar5;
  undefined4 in_register_00000084;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *results_00;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *pSVar6;
  long lVar7;
  string_view pattern_00;
  string_view pattern_01;
  string_view pattern_02;
  string_view pattern_03;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool *in_stack_fffffffffffffee8;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  path currPath;
  flat_hash_set<std::string> visited;
  SmallVector<std::filesystem::__cxx11::path,_2UL> dirs;
  
  results_00 = (SmallVector<std::filesystem::__cxx11::path,_2UL> *)
               CONCAT44(in_register_00000084,mode);
  pattern_01._M_str._0_4_ = (uint)pattern._M_str;
  local_108._M_str = (char *)pattern._M_len;
  local_108._M_len = (size_t)basePath;
  pSVar6 = results;
  std::filesystem::__cxx11::path::path(&currPath,(path *)this);
  ppVar4 = basePath;
  do {
    if (ppVar4 == (path *)0x0) {
      if ((uint)pattern_01._M_str == 0) {
        iterDirectory(&currPath,results_00,Files);
        GVar3 = Directory;
      }
      else {
        dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
             (pointer)((ulong)dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ &
                      0xffffffff00000000);
        dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = std::_V2::system_category()
        ;
        bVar2 = std::filesystem::is_directory(&currPath,(error_code *)&dirs);
        if (bVar2) {
          SmallVectorBase<std::filesystem::__cxx11::path>::
          emplace_back<std::filesystem::__cxx11::path>
                    ((SmallVectorBase<std::filesystem::__cxx11::path> *)results_00,&currPath);
        }
        GVar3 = Directory;
        if ((basePath != (path *)0x0) &&
           ((basePath != (path *)0x1 || (*(char *)pattern._M_len != '/')))) {
LAB_001a957a:
          GVar3 = SimpleName;
        }
      }
LAB_001a957e:
      std::filesystem::__cxx11::path::~path(&currPath);
      return GVar3;
    }
    __x._M_str = "...";
    __x._M_len = 3;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with(&local_108,__x);
    if (bVar2) {
      dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
           (pointer)dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
      dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
      dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
      boost::unordered::
      unordered_flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_flat_set(&visited);
      iterDirectoriesRecursive(&currPath,&dirs,&visited);
      SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<std::filesystem::__cxx11::path>
                (&dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>,&currPath);
      ppVar4 = (path *)0x3;
      local_108 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            (&local_108,3,0xffffffffffffffff);
      GVar3 = Directory;
      ppVar5 = dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
      for (lVar7 = dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.len * 0x28; lVar7 != 0
          ; lVar7 = lVar7 + -0x28) {
        pattern_01._M_len = (size_t)local_108._M_str;
        pattern_01._M_str._4_4_ = 0;
        ppVar4 = (path *)local_108._M_len;
        GVar3 = svGlobInternal((slang *)ppVar5,(path *)local_108._M_len,pattern_01,mode,results,
                               in_stack_fffffffffffffee8);
        ppVar5 = ppVar5 + 1;
      }
      *(undefined1 *)&(results->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&visited);
LAB_001a9730:
      SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
                (&dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>,(EVP_PKEY_CTX *)ppVar4)
      ;
      goto LAB_001a957e;
    }
    ppVar4 = (path *)0x0;
    bVar2 = false;
    while( true ) {
      if ((path *)local_108._M_len == ppVar4) {
        if (bVar2) {
          pattern_00._M_str = (char *)results_00;
          pattern_00._M_len = (size_t)local_108._M_str;
          globDir((slang *)&currPath,(path *)local_108._M_len,pattern_00,
                  (SmallVector<std::filesystem::__cxx11::path,_2UL> *)(ulong)(uint)pattern_01._M_str
                  ,(GlobMode)pSVar6);
          *(undefined1 *)&(results->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1
          ;
          GVar3 = WildcardName;
          goto LAB_001a957e;
        }
        dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
             (pointer)((ulong)dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ &
                      0xffffffff00000000);
        dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = std::_V2::system_category()
        ;
        std::filesystem::__cxx11::path::operator/=(&currPath,&local_108);
        if ((uint)pattern_01._M_str == 1) {
          bVar2 = std::filesystem::is_directory(&currPath,(error_code *)&dirs);
        }
        else {
          if ((uint)pattern_01._M_str != 0) goto LAB_001a957a;
          bVar2 = std::filesystem::is_regular_file(&currPath,(error_code *)&dirs);
        }
        if (bVar2 != false) {
          SmallVectorBase<std::filesystem::__cxx11::path>::
          emplace_back<std::filesystem::__cxx11::path>
                    ((SmallVectorBase<std::filesystem::__cxx11::path> *)results_00,&currPath);
        }
        goto LAB_001a957a;
      }
      cVar1 = local_108._M_str[(long)ppVar4];
      bVar2 = (bool)(bVar2 | (cVar1 == '*' || cVar1 == '?'));
      if (cVar1 == '/') break;
      ppVar4 = (path *)((long)&(ppVar4->_M_pathname)._M_dataplus._M_p + 1);
    }
    visited.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
    .arrays._0_16_ =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   (&local_108,0,(size_type)ppVar4);
    local_108 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&local_108,(size_type)((long)&(ppVar4->_M_pathname)._M_dataplus._M_p + 1)
                           ,0xffffffffffffffff);
    if (bVar2) {
      dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
           (pointer)dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
      dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
      dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
      pattern_02._M_str = (char *)&dirs;
      pattern_02._M_len =
           visited.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
           .arrays.groups_size_mask;
      ppVar4 = (path *)visited.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
                       .arrays.groups_size_index;
      globDir((slang *)&currPath,
              (path *)visited.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
                      .arrays.groups_size_index,pattern_02,
              (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x1,(GlobMode)pSVar6);
      GVar3 = Directory;
      ppVar5 = dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
      for (lVar7 = dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.len * 0x28; lVar7 != 0
          ; lVar7 = lVar7 + -0x28) {
        pattern_03._M_str._0_4_ = (uint)pattern_01._M_str;
        pattern_03._M_len = (size_t)local_108._M_str;
        pattern_03._M_str._4_4_ = 0;
        ppVar4 = (path *)local_108._M_len;
        GVar3 = svGlobInternal((slang *)ppVar5,(path *)local_108._M_len,pattern_03,mode,results,
                               in_stack_fffffffffffffee8);
        ppVar5 = ppVar5 + 1;
      }
      *(undefined1 *)&(results->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1;
      goto LAB_001a9730;
    }
    std::filesystem::__cxx11::path::operator/=
              (&currPath,(basic_string_view<char,_std::char_traits<char>_> *)&visited);
    ppVar4 = (path *)local_108._M_len;
  } while( true );
}

Assistant:

GlobRank svGlobInternal(const fs::path& basePath, std::string_view pattern, GlobMode mode,
                        SmallVector<fs::path>& results, bool& anyWildcards) {
    // Parse the pattern. Consume directories in chunks until
    // we find one that has wildcards for us to handle.
    auto currPath = basePath;
    const auto originalPattern = pattern;
    while (!pattern.empty()) {
        // The '...' pattern only applies at the start of a segment,
        // and means to recursively pull all directories.
        if (pattern.starts_with("..."sv)) {
            SmallVector<fs::path> dirs;
            flat_hash_set<std::string> visited;
            iterDirectoriesRecursive(currPath, dirs, visited);
            dirs.emplace_back(std::move(currPath));

            pattern = pattern.substr(3);

            auto rank = GlobRank::Directory;
            for (auto& dir : dirs)
                rank = svGlobInternal(dir, pattern, mode, results, anyWildcards);

            anyWildcards = true;
            return rank;
        }

        bool hasWildcards = false;
        bool foundDir = false;
        for (size_t i = 0; i < pattern.size(); i++) {
            char c = pattern[i];
            hasWildcards |= (c == '?' || c == '*');
            if (c == fs::path::preferred_separator) {
                auto subPattern = pattern.substr(0, i);
                pattern = pattern.substr(i + 1);

                // If this directory entry had wildcards we need to expand them
                // and recursively search within each expanded directory.
                if (hasWildcards) {
                    SmallVector<fs::path> dirs;
                    globDir(currPath, subPattern, dirs, GlobMode::Directories);

                    auto rank = GlobRank::Directory;
                    for (auto& dir : dirs)
                        rank = svGlobInternal(dir, pattern, mode, results, anyWildcards);

                    anyWildcards = true;
                    return rank;
                }

                // Otherwise just record this directory and move on to the next.
                foundDir = true;
                currPath /= subPattern;
                break;
            }
        }

        // We didn't find a directory separator, so we're going to consume
        // the remainder of the pattern and search for files/directories with
        // that pattern.
        if (!foundDir) {
            if (hasWildcards) {
                globDir(currPath, pattern, results, mode);
                anyWildcards = true;
                return GlobRank::WildcardName;
            }

            // Check for an exact match and add the target if we find it.
            std::error_code ec;
            currPath /= pattern;

            if ((mode == GlobMode::Files && fs::is_regular_file(currPath, ec)) ||
                (mode == GlobMode::Directories && fs::is_directory(currPath, ec))) {
                results.emplace_back(std::move(currPath));
            }

            return GlobRank::SimpleName;
        }
    }

    // If we reach this point, we either had an empty pattern to
    // begin with or we consumed the whole pattern and it had a trailing
    // directory separator. If we are searching for files we want to include
    // all files underneath the directory pointed to by currPath, and if
    // we're searching for directories we'll just take this directory.
    if (mode == GlobMode::Files) {
        iterDirectory(currPath, results, GlobMode::Files);
        return GlobRank::Directory;
    }
    else {
        std::error_code ec;
        if (fs::is_directory(currPath, ec))
            results.emplace_back(std::move(currPath));

        if (originalPattern.empty() ||
            (originalPattern.size() == 1 && originalPattern[0] == fs::path::preferred_separator)) {
            return GlobRank::Directory;
        }
        else {
            return GlobRank::SimpleName;
        }
    }
}